

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListIteratorTest_begin_end_forward_Test::TestBody
          (IntrusiveListIteratorTest_begin_end_forward_Test *this)

{
  TestObjectList *pTVar1;
  TestObject *pTVar2;
  IntrusiveListIteratorTest *this_00;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  pointer pTVar6;
  int line;
  unsigned_long uVar7;
  char *message;
  vector<int,_std::allocator<int>_> *in_R9;
  long lVar8;
  int *lhs;
  iterator rhs;
  const_iterator first;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  AssertionResult gtest_ar;
  _Vector_base<int,_std::allocator<int>_> local_88;
  IntrusiveListIteratorTest_begin_end_forward_Test *local_68;
  AssertHelper local_60;
  unsigned_long local_58;
  iterator local_50;
  undefined8 local_3c;
  undefined4 local_34;
  
  pTVar1 = &(this->super_IntrusiveListIteratorTest).list_;
  pTVar2 = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_3c = 0x200000001;
  local_34 = 3;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = this;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_88,&local_3c);
  lVar8 = 0;
  uVar7 = 0;
  local_50.list_ = pTVar1;
  local_50.node_ = pTVar2;
  do {
    rhs.node_ = (TestObject *)0x0;
    rhs.list_ = pTVar1;
    local_58 = uVar7;
    bVar5 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator::operator!=
                      (&local_50,rhs);
    if (!bVar5) {
      local_a0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)local_88._M_impl.super__Vector_impl_data._M_finish -
            (long)local_88._M_impl.super__Vector_impl_data._M_start >> 2);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"count","expected.size()",&local_58,
                 (unsigned_long *)&local_a0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_a0);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = "";
        }
        else {
          message = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        line = 0xa5;
LAB_0013c707:
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-intrusive-list.cc"
                   ,line,message);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_a0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_a0._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
      this_00 = (IntrusiveListIteratorTest *)(local_68->super_IntrusiveListIteratorTest).clist_;
      piVar3 = (intrusive_list<(anonymous_namespace)::TestObject> *)
               (this_00->super_IntrusiveListTest).super_Test._vptr_Test;
      local_50.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)0x200000001;
      local_50.node_ = (TestObject *)CONCAT44(local_50.node_._4_4_,3);
      local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
                ((vector<int,std::allocator<int>> *)&local_88,&local_50);
      first.node_ = (TestObject *)this_00;
      first.list_ = piVar3;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (vector<int,std::allocator<int>> *)&local_88;
      anon_unknown.dwarf_599a8::IntrusiveListIteratorTest::
      TestForward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                (this_00,first,(const_iterator)(auVar4 << 0x40),in_R9);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
      return;
    }
    lhs = (int *)((long)local_88._M_impl.super__Vector_impl_data._M_start + lVar8);
    pTVar6 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator::operator->
                       (&local_50);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"expected[count]","first->data",lhs,&pTVar6->data);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      line = 0xa1;
      goto LAB_0013c707;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator::operator++(&local_50);
    uVar7 = uVar7 + 1;
    lVar8 = lVar8 + 4;
  } while( true );
}

Assistant:

TEST_F(IntrusiveListIteratorTest, begin_end_forward) {
  TestForward(list_.begin(), list_.end(), {1, 2, 3});
  TestForward(clist_.begin(), clist_.end(), {1, 2, 3});
}